

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O2

void prng_read(prng *pr,void *vout,size_t size)

{
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr **pp_Var1;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var2;
  ssh_hash *psVar3;
  ssh_hashalg *psVar4;
  uint i_1;
  ssh_hash *h;
  long lVar5;
  ulong uVar6;
  uint i;
  uint uVar7;
  uchar buf [114];
  
  if (pr[2].savesize != 0) {
    __assert_fail("!pi->keymaker",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/prng.c",
                  0xdd,"void prng_read(prng *, void *, size_t)");
  }
  for (; size != 0; size = size - uVar6) {
    psVar3 = (ssh_hash *)pr[1].binarysink_[0].write;
    psVar4 = psVar3->vt;
    h = (*psVar4->new)(psVar4);
    (*h->vt->copyfrom)(h,psVar3);
    BinarySink_put_byte(h->binarysink_,'G');
    for (uVar7 = 0; uVar7 < 0x80; uVar7 = uVar7 + 8) {
      BinarySink_put_byte(h->binarysink_,
                          (uchar)((ulong)(&pr[1].binarysink_[0].writefmtv)[uVar7 >> 6] >>
                                 ((byte)uVar7 & 0x38)));
    }
    uVar6 = 1;
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      pp_Var1 = &pr[1].binarysink_[0].writefmtv + lVar5;
      p_Var2 = *pp_Var1;
      *pp_Var1 = *pp_Var1 + uVar6;
      uVar6 = (ulong)CARRY8((ulong)p_Var2,uVar6);
    }
    ssh_hash_final(h,buf);
    uVar6 = *(ulong *)(pr[1].savesize + 0x28);
    if (size < uVar6) {
      uVar6 = size;
    }
    memcpy(vout,buf,uVar6);
    vout = (void *)((long)vout + uVar6);
  }
  smemclr(buf,0x72);
  prng_seed_begin(pr);
  prng_seed_finish(pr);
  return;
}

Assistant:

void prng_read(prng *pr, void *vout, size_t size)
{
    prng_impl *pi = container_of(pr, prng_impl, Prng);
    unsigned char buf[MAX_HASH_LEN];

    assert(!pi->keymaker);

    prngdebug("prng_read %"SIZEu"\n", size);

    uint8_t *out = (uint8_t *)vout;
    while (size > 0) {
        prng_generate(pi, buf);
        size_t to_use = size > pi->hashalg->hlen ? pi->hashalg->hlen : size;
        memcpy(out, buf, to_use);
        out += to_use;
        size -= to_use;
    }

    smemclr(buf, sizeof(buf));

    prng_seed_begin(&pi->Prng);
    prng_seed_finish(&pi->Prng);
}